

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void relative8_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t address_00;
  uint16_t *in_RDX;
  MCInst *in_RSI;
  long in_RDI;
  int16_t offset;
  int16_t local_1a;
  
  local_1a = 0;
  address_00 = *in_RDX;
  *in_RDX = address_00 + 1;
  read_byte_sign_extended((m680x_info *)in_RSI,&local_1a,address_00);
  add_rel_operand((m680x_info *)in_RSI,local_1a,*in_RDX + local_1a);
  add_insn_group(*(cs_detail **)(*(long *)(in_RDI + 0x310) + 0xf0),M680X_GRP_BRAREL);
  if (((in_RSI->Operands[0xe].field_2.RegVal != 0x44) &&
      (in_RSI->Operands[0xe].field_2.RegVal != 0x47)) &&
     (in_RSI->Operands[0xe].field_2.RegVal != 0x45)) {
    add_reg_to_rw_list(in_RSI,(m680x_reg)((ulong)in_RDX >> 0x20),(e_access)in_RDX);
  }
  return;
}

Assistant:

static void relative8_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	int16_t offset = 0;

	read_byte_sign_extended(info, &offset, (*address)++);
	add_rel_operand(info, offset, *address + offset);
	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);

	if ((info->insn != M680X_INS_BRA) &&
		(info->insn != M680X_INS_BSR) &&
		(info->insn != M680X_INS_BRN))
		add_reg_to_rw_list(MI, M680X_REG_CC, READ);
}